

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O0

Event __thiscall Storage::Disk::PCMSegmentEventSource::get_next_event(PCMSegmentEventSource *this)

{
  ulong uVar1;
  Event EVar2;
  ulong uVar3;
  bool bVar4;
  element_type *peVar5;
  size_type sVar6;
  unsigned_long uVar7;
  bool bVar8;
  uint local_6c;
  reference local_50;
  reference local_40;
  byte local_29;
  size_t sStack_28;
  bool bit;
  size_t initial_bit_pointer;
  PCMSegmentEventSource *this_local;
  undefined4 uStack_10;
  uint local_c;
  
  sStack_28 = this->bit_pointer_;
  initial_bit_pointer = (size_t)this;
  if (this->bit_pointer_ == 0) {
    peVar5 = std::
             __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_6c = -((peVar5->length_of_a_bit).length >> 1);
  }
  else {
    local_6c = 0;
  }
  (this->next_event_).length.length = local_6c;
  do {
    uVar1 = this->bit_pointer_;
    peVar5 = std::
             __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    sVar6 = std::vector<bool,_std::allocator<bool>_>::size(&peVar5->data);
    uVar3 = sStack_28;
    if (sVar6 <= uVar1) {
      (this->next_event_).type = IndexHole;
      peVar5 = std::
               __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      sVar6 = std::vector<bool,_std::allocator<bool>_>::size(&peVar5->data);
      if (uVar3 <= sVar6) {
        peVar5 = std::
                 __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (this->next_event_).length.length =
             ((peVar5->length_of_a_bit).length >> 1) + (this->next_event_).length.length;
        this->bit_pointer_ = this->bit_pointer_ + 1;
      }
      this_local._4_4_ = (this->next_event_).type;
      uStack_10 = (this->next_event_).length.length;
      local_c = (this->next_event_).length.clock_rate;
      goto LAB_009975de;
    }
    peVar5 = std::
             __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&peVar5->data,this->bit_pointer_);
    local_29 = std::_Bit_reference::operator_cast_to_bool(&local_40);
    this->bit_pointer_ = this->bit_pointer_ + 1;
    peVar5 = std::
             __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (this->next_event_).length.length =
         (peVar5->length_of_a_bit).length + (this->next_event_).length.length;
    bVar8 = true;
    if ((local_29 & 1) == 0) {
      peVar5 = std::
               __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      bVar4 = std::vector<bool,_std::allocator<bool>_>::empty(&peVar5->fuzzy_mask);
      bVar8 = false;
      if (!bVar4) {
        peVar5 = std::
                 __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&peVar5->fuzzy_mask,this->bit_pointer_);
        bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_50);
        bVar8 = false;
        if (bVar4) {
          uVar7 = Numeric::LFSR<unsigned_long,_9223372036854782434UL>::next(&this->lfsr_);
          bVar8 = uVar7 != 0;
        }
      }
    }
  } while (!bVar8);
  this_local._4_4_ = (this->next_event_).type;
  uStack_10 = (this->next_event_).length.length;
  local_c = (this->next_event_).length.clock_rate;
LAB_009975de:
  EVar2.length.clock_rate = local_c;
  EVar2.type = this_local._4_4_;
  EVar2.length.length = uStack_10;
  return EVar2;
}

Assistant:

Storage::Disk::Track::Event PCMSegmentEventSource::get_next_event() {
	// Track the initial bit pointer for potentially considering whether this was an
	// initial index hole or a subsequent one later on.
	const std::size_t initial_bit_pointer = bit_pointer_;

	// If starting from the beginning, pull half a bit backward, as if the initial bit
	// is set, it should be in the centre of its window.
	next_event_.length.length = bit_pointer_ ? 0 : -(segment_->length_of_a_bit.length >> 1);

	// search for the next bit that is set, if any
	while(bit_pointer_ < segment_->data.size()) {
		bool bit = segment_->data[bit_pointer_];
		++bit_pointer_;	// so this always points one beyond the most recent bit returned
		next_event_.length.length += segment_->length_of_a_bit.length;

		// if this bit is set, or is fuzzy and a random bit of 1 is selected, return the event.
		if(bit ||
			(!segment_->fuzzy_mask.empty() && segment_->fuzzy_mask[bit_pointer_] && lfsr_.next())
		)	return next_event_;
	}

	// If the end is reached without a bit being set, it'll be index holes from now on.
	next_event_.type = Track::Event::IndexHole;

	// Test whether this is the very first time that bits have been exhausted. If so then
	// allow an extra half bit's length to run from the position of the potential final transition
	// event to the end of the segment. Otherwise don't allow any extra time, as it's already
	// been consumed.
	if(initial_bit_pointer <= segment_->data.size()) {
		next_event_.length.length += (segment_->length_of_a_bit.length >> 1);
		bit_pointer_++;
	}
	return next_event_;
}